

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

MOJOSHADER_parseData *
MOJOSHADER_parse(char *profile,char *mainfn,uchar *tokenbuf,uint bufsize,MOJOSHADER_swizzle *swiz,
                uint swizcount,MOJOSHADER_samplerMap *smap,uint smapcount,MOJOSHADER_malloc m,
                MOJOSHADER_free f,void *d)

{
  uint uVar1;
  SourceMod SVar2;
  MOJOSHADER_swizzle *pMVar3;
  uint32 *tokens;
  uint *puVar4;
  bool bVar5;
  long lVar6;
  uint32 uVar7;
  RegisterList *pRVar8;
  int iVar9;
  int iVar10;
  Context *ctx;
  char *pcVar11;
  RegisterList *pRVar12;
  RegisterList *pRVar13;
  MOJOSHADER_parseData *pMVar14;
  MOJOSHADER_usage usage;
  long lVar15;
  RegisterList *pRVar16;
  MOJOSHADER_shaderType MVar17;
  RegisterType RVar18;
  uint uVar19;
  ulong uVar20;
  RegisterList *pRVar21;
  VariableList *pVVar22;
  VariableList **ppVVar23;
  uint uVar24;
  uint32 local_84;
  undefined8 local_80;
  uint local_74;
  RegisterList *local_70;
  uint32 local_68;
  int local_64;
  char *local_60;
  SourceArgInfo *arg;
  int *local_50;
  code *local_48;
  uint32 *local_40;
  CtabData *local_38;
  
  if (((m == (MOJOSHADER_malloc)0x0 && f != (MOJOSHADER_free)0x0) ||
      (m != (MOJOSHADER_malloc)0x0 && f == (MOJOSHADER_free)0x0)) ||
     (ctx = build_context(profile,mainfn,tokenbuf,bufsize,swiz,swizcount,smap,smapcount,m,f,d),
     ctx == (Context *)0x0)) {
    return &MOJOSHADER_out_of_mem_data;
  }
  if (profile == (char *)0x0) {
    fail(ctx,"Profile name is NULL");
  }
  if (ctx->isfail != 0) goto LAB_0010a3e0;
  lVar15 = 0;
  do {
    if ((ulong)ctx->swizzles_count * 0xc + 0xc == lVar15 + 0xc) goto LAB_00109ac7;
    pMVar3 = ctx->swizzles;
  } while (((pMVar3->swizzles[lVar15] < 4) && (pMVar3->swizzles[lVar15 + 1] < 4)) &&
          ((pMVar3->swizzles[lVar15 + 2] < 4 &&
           (lVar6 = lVar15 + 3, lVar15 = lVar15 + 0xc, pMVar3->swizzles[lVar6] < 4))));
  fail(ctx,"invalid swizzle");
LAB_00109ac7:
  ctx->current_position = 0;
  if (ctx->tokencount == 0) {
    fail(ctx,"Expected version token, got none at all.");
    bVar5 = false;
    uVar19 = 0;
  }
  else {
    uVar19 = *ctx->tokens;
    ctx->version_token = uVar19;
    if (uVar19 >> 0x10 == 0xffff) {
      MVar17 = MOJOSHADER_TYPE_PIXEL;
      pcVar11 = "ps";
    }
    else {
      if (uVar19 >> 0x10 != 0xfffe) {
        fail(ctx,"Unsupported shader type or not a shader at all");
        uVar19 = 0xffffffff;
        bVar5 = true;
        goto LAB_00109bc3;
      }
      pcVar11 = "vs";
      MVar17 = MOJOSHADER_TYPE_VERTEX;
    }
    ctx->shader_type = MVar17;
    ctx->shader_type_str = pcVar11;
    ctx->major_ver = (uint8)(uVar19 >> 8);
    ctx->minor_ver = (uint8)uVar19;
    uVar24 = 0;
    if ((uint8)uVar19 != 0xff) {
      uVar24 = uVar19 & 0xfe;
    }
    if (0x30001 < (uVar24 | (uVar19 >> 8 & 0xff) << 0x10)) {
      failf(ctx,"Shader Model %u.%u is currently unsupported.",(ulong)(uVar19 >> 8 & 0xff),
            (ulong)(uVar19 & 0xff));
    }
    uVar19 = 1;
    if (ctx->isfail == 0) {
      (*ctx->profile->start_emitter)(ctx,profile);
    }
    bVar5 = false;
  }
LAB_00109bc3:
  if (ctx->mainfn == (char *)0x0) {
    pcVar11 = StrDup(ctx,"main");
    ctx->mainfn = pcVar11;
  }
  if (!bVar5) {
    if (ctx->tokencount < uVar19) {
      fail(ctx,"Corrupted or truncated shader");
      ctx->tokencount = uVar19;
    }
    adjust_token_position(ctx,uVar19);
    local_38 = &ctx->ctab;
    local_40 = ctx->dwords;
    arg = &ctx->predicate_arg;
    local_50 = &ctx->texm3x2pad_dst0;
    local_80 = (RegisterList *)((ulong)local_80._4_4_ << 0x20);
    while (ctx->tokencount != 0) {
      if (ctx->know_shader_size == 0) {
        ctx->tokencount = 0xffffffff;
      }
      uVar19 = 1;
      if (ctx->isfail != 0) {
        ctx->isfail = 0;
        local_80 = (RegisterList *)CONCAT44(local_80._4_4_,1);
      }
      if (ctx->output_stack_len != 0) {
        __assert_fail("ctx->output_stack_len == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x2b63,"int parse_token(Context *)");
      }
      local_84 = 0;
      iVar9 = is_comment_token(ctx,*ctx->tokens,&local_84);
      uVar7 = local_84;
      if (iVar9 == 0) {
LAB_00109ce6:
        puVar4 = ctx->tokens;
        uVar1 = *puVar4;
        uVar20 = (ulong)uVar1;
        uVar24 = uVar19;
        if (uVar20 == 0xfffd) {
          if (((ctx->shader_type != MOJOSHADER_TYPE_PIXEL) || (ctx->major_ver != '\x01')) ||
             (ctx->minor_ver != '\x04')) {
            fail(ctx,"phase token only available in 1.4 pixel shaders");
          }
          if (ctx->isfail == 0) {
            (*ctx->profile->phase_emitter)(ctx);
          }
        }
        else if (uVar1 == 0xffff) {
          if (ctx->know_shader_size == 0) {
            ctx->tokencount = 1;
          }
          else if (ctx->tokencount != 1) {
            fail(ctx,"end token before end of stream");
          }
          if (ctx->isfail == 0) {
            (*ctx->profile->end_emitter)(ctx);
          }
        }
        else {
          pRVar12 = (RegisterList *)(uVar20 & 0xffff);
          if ((uint)pRVar12 < 0x61) {
            local_64 = ctx->current_position;
            local_68 = ctx->tokencount;
            local_48 = *(code **)((long)pRVar12 * 0x48 + 0x143ad0 + (long)ctx->profileid * 8);
            local_70 = pRVar12;
            if ((int)uVar1 < 0) {
              fail(ctx,"instruction token high bit must be zero.");
            }
            uVar24 = uVar1 >> 0x18 & 0xf;
            pcVar11 = instructions[(long)pRVar12].opcode_string;
            if (pcVar11 == (char *)0x0) {
              fail(ctx,"Unknown opcode.");
              uVar24 = uVar24 + 1;
            }
            else {
              ctx->coissue = (uVar1 & 0x40000000) >> 0x1e;
              local_60 = pcVar11;
              if ((uVar1 & 0x40000000) != 0) {
                if (ctx->shader_type != MOJOSHADER_TYPE_PIXEL) {
                  fail(ctx,"coissue instruction on non-pixel shader");
                }
                iVar9 = shader_version_atleast(ctx,'\x02','\0');
                if (iVar9 != 0) {
                  fail(ctx,"coissue instruction in Shader Model >= 2.0");
                }
              }
              local_74 = uVar24;
              if ((ctx->shader_type & instructions[(long)pRVar12].shader_types) ==
                  MOJOSHADER_TYPE_UNKNOWN) {
                failf(ctx,"opcode \'%s\' not available in this shader type.",local_60);
              }
              local_40[0] = 0;
              local_40[1] = 0;
              local_40[2] = 0;
              local_40[3] = 0;
              ctx->instruction_controls = uVar1 >> 0x10 & 0xff;
              ctx->predicated = (uVar1 & 0x10000000) >> 0x1c;
              ctx->tokens = ctx->tokens + 1;
              ctx->tokencount = ctx->tokencount - 1;
              ctx->current_position = ctx->current_position + 4;
              uVar24 = (*instructions[(long)pRVar12].parse_args)(ctx);
              if ((uVar1 & 0x10000000) != 0) {
                parse_source_token(ctx,arg);
                if ((ctx->predicate_arg).regtype != REG_TYPE_MAX) {
                  fail(ctx,"Predicated instruction but not predicate register!");
                }
                SVar2 = (ctx->predicate_arg).src_mod;
                if ((SVar2 != SRCMOD_NONE) && (SVar2 != SRCMOD_NOT)) {
                  fail(ctx,"Predicated instruction register is not NONE or NOT");
                }
                iVar9 = (ctx->predicate_arg).swizzle;
                if ((iVar9 != 0xe4) && (iVar9 = replicate_swizzle(iVar9), iVar9 == 0)) {
                  fail(ctx,"Predicated instruction register has wrong swizzle");
                }
                if ((ctx->predicate_arg).relative != 0) {
                  fail(ctx,"relative addressing in predicated token");
                }
                uVar24 = uVar24 + 1;
              }
              ctx->tokens = puVar4;
              ctx->tokencount = local_68;
              ctx->current_position = local_64;
              if (instructions[(long)pRVar12].state != (state_function)0x0) {
                (*instructions[(long)pRVar12].state)(ctx);
              }
              ctx->instruction_count = ctx->instruction_count + instructions[(long)pRVar12].slots;
              if (ctx->isfail == 0) {
                (*local_48)(ctx);
              }
              if (ctx->reset_texmpad != 0) {
                *(undefined8 *)(local_50 + 4) = 0xffffffffffffffff;
                *local_50 = -1;
                local_50[1] = -1;
                local_50[2] = -1;
                local_50[3] = -1;
                ctx->reset_texmpad = 0;
              }
              ctx->previous_opcode = (uint32)local_70;
              ctx->scratch_registers = 0;
              iVar9 = shader_version_atleast(ctx,'\x02','\0');
              if (iVar9 == 0) {
                if (local_74 != 0) {
                  fail(ctx,"instruction token count must be zero");
                }
                if (uVar24 == 0) {
                  uVar20 = (ulong)*ctx->tokens;
                  goto LAB_00109d79;
                }
              }
              else {
                uVar19 = local_74 + 1;
                if (uVar24 != uVar19) {
                  failf(ctx,"wrong token count (%u, not %u) for opcode \'%s\'.",(ulong)uVar24,
                        (ulong)uVar19);
                  uVar24 = uVar19;
                }
              }
            }
          }
          else {
LAB_00109d79:
            failf(ctx,"unknown token (0x%x)",uVar20);
            uVar24 = uVar19;
          }
        }
      }
      else {
        if (1 < local_84) {
          if (ctx->tokencount <= local_84) {
            uVar24 = local_84 + 1;
            if (local_84 + 1 == 0) goto LAB_00109ce6;
            goto LAB_0010a030;
          }
          tokens = ctx->tokens;
          if (tokens[1] == 0x42415443) {
            parse_constant_table(ctx,tokens,local_84 * 4,ctx->version_token,1,local_38);
          }
          else if (tokens[1] == 0x53455250) {
            parse_preshader(ctx,tokens + 2,local_84 - 2);
          }
        }
        uVar24 = uVar7 + 1;
      }
LAB_0010a030:
      if (ctx->tokencount < uVar24) {
        fail(ctx,"Corrupted or truncated shader");
        break;
      }
      adjust_token_position(ctx,uVar24);
    }
    ctx->current_position = -1;
    if (((ctx->shader_type == MOJOSHADER_TYPE_PIXEL) &&
        (iVar9 = shader_version_atleast(ctx,'\x02','\0'), iVar9 == 0)) &&
       ((pRVar12 = reglist_find(&ctx->used_registers,REG_TYPE_TEMP,0),
        pRVar12 == (RegisterList *)0x0 || (pRVar12->written == 0)))) {
      fail(ctx,"r0 (pixel shader 1.x color output) never written to");
    }
    if ((int)local_80 == 0) {
      determine_constants_arrays(ctx);
      local_70 = &ctx->defined_registers;
      pRVar8 = &ctx->used_registers;
      pRVar12 = (ctx->used_registers).next;
      local_80 = &ctx->uniforms;
      while (pRVar21 = pRVar12, pRVar16 = pRVar8, pRVar21 != (RegisterList *)0x0) {
        pRVar12 = pRVar21->next;
        RVar18 = pRVar21->regtype;
        iVar9 = pRVar21->regnum;
        pRVar13 = reglist_find(local_70,RVar18,iVar9);
        pRVar8 = pRVar21;
        if (pRVar13 == (RegisterList *)0x0) {
          switch(RVar18) {
          case REG_TYPE_TEMP:
          case REG_TYPE_ADDRESS:
          case REG_TYPE_LOOP:
          case REG_TYPE_LABEL:
          case REG_TYPE_MAX:
            (*ctx->profile->global_emitter)(ctx,RVar18,iVar9);
            break;
          case REG_TYPE_INPUT:
            if ((ctx->shader_type == MOJOSHADER_TYPE_PIXEL) &&
               (iVar10 = shader_version_atleast(ctx,'\x02','\0'), iVar10 == 0)) {
              RVar18 = REG_TYPE_INPUT;
              usage = MOJOSHADER_USAGE_COLOR;
              iVar10 = iVar9;
              goto LAB_0010a1b9;
            }
          default:
            fail(ctx,"BUG: we used a register we don\'t know how to define.");
            break;
          case REG_TYPE_CONST:
          case REG_TYPE_CONSTINT:
          case REG_TYPE_CONSTBOOL:
            pRVar16->next = pRVar12;
            pRVar21->next = (RegisterList *)0x0;
            local_80->next = pRVar21;
            pRVar8 = pRVar16;
            local_80 = pRVar21;
            break;
          case REG_TYPE_RASTOUT:
          case REG_TYPE_ATTROUT:
          case REG_TYPE_OUTPUT:
          case REG_TYPE_COLOROUT:
          case REG_TYPE_DEPTHOUT:
            if ((ctx->shader_type == MOJOSHADER_TYPE_VERTEX) &&
               (iVar10 = shader_version_atleast(ctx,'\x03','\0'), iVar10 != 0)) {
              fail(ctx,"vs_3 can\'t use output registers without declaring them first.");
              goto LAB_0010a3c9;
            }
            usage = MOJOSHADER_USAGE_UNKNOWN;
            iVar10 = 0;
LAB_0010a1b9:
            add_attribute_register(ctx,RVar18,iVar9,usage,iVar10,0xf,0);
          }
        }
      }
      ppVVar23 = &ctx->variables;
      while (pVVar22 = *ppVVar23, pVVar22 != (VariableList *)0x0) {
        if (pVVar22->used != 0) {
          if (pVVar22->constant == (ConstantsList *)0x0) {
            (*ctx->profile->array_emitter)(ctx,pVVar22);
            ctx->uniform_float4_count = ctx->uniform_float4_count + pVVar22->count;
          }
          else {
            (*ctx->profile->const_array_emitter)
                      (ctx,pVVar22->constant,pVVar22->index,pVVar22->count);
          }
          ctx->uniform_count = ctx->uniform_count + 1;
        }
        ppVVar23 = &pVVar22->next;
      }
      pRVar12 = &ctx->uniforms;
      pVVar22 = (VariableList *)0x0;
      while (pRVar12 = pRVar12->next, pRVar12 != (RegisterList *)0x0) {
        bVar5 = true;
        ppVVar23 = &ctx->variables;
        if (pRVar12->regtype == REG_TYPE_CONST) {
          while (pVVar22 = *ppVVar23, pVVar22 != (VariableList *)0x0) {
            if (pVVar22->used != 0) {
              if ((pVVar22->index <= pRVar12->regnum) &&
                 (pRVar12->regnum < pVVar22->index + pVVar22->count)) {
                if (pVVar22->constant != (ConstantsList *)0x0) {
                  __assert_fail("!var->constant",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                                ,0x2e65,"void process_definitions(Context *)");
                }
                pRVar12->array = pVVar22;
                bVar5 = false;
                goto LAB_0010a2e2;
              }
            }
            ppVVar23 = &pVVar22->next;
          }
          pVVar22 = (VariableList *)0x0;
        }
LAB_0010a2e2:
        (*ctx->profile->uniform_emitter)(ctx,pRVar12->regtype,pRVar12->regnum,pVVar22);
        if (bVar5) {
          ctx->uniform_count = ctx->uniform_count + 1;
          RVar18 = pRVar12->regtype;
          if (RVar18 == REG_TYPE_CONSTBOOL) {
            ctx->uniform_bool_count = ctx->uniform_bool_count + 1;
          }
          else if (RVar18 == REG_TYPE_CONSTINT) {
            ctx->uniform_int4_count = ctx->uniform_int4_count + 1;
          }
          else if (RVar18 == REG_TYPE_CONST) {
            ctx->uniform_float4_count = ctx->uniform_float4_count + 1;
          }
        }
      }
      pRVar12 = &ctx->samplers;
      while (pRVar12 = pRVar12->next, pRVar12 != (RegisterList *)0x0) {
        ctx->sampler_count = ctx->sampler_count + 1;
        (*ctx->profile->sampler_emitter)
                  (ctx,pRVar12->regnum,pRVar12->index,SUB14(pRVar12->misc != 0,0));
      }
      pRVar12 = &ctx->attributes;
      while (pRVar12 = pRVar12->next, pRVar12 != (RegisterList *)0x0) {
        ctx->attribute_count = ctx->attribute_count + 1;
        (*ctx->profile->attribute_emitter)
                  (ctx,pRVar12->regtype,pRVar12->regnum,pRVar12->usage,pRVar12->index,
                   pRVar12->writemask,pRVar12->misc);
      }
LAB_0010a3c9:
      iVar9 = ctx->isfail;
      if (iVar9 == 0) {
        (*ctx->profile->finalize_emitter)(ctx);
        iVar9 = 0;
      }
    }
    else {
      iVar9 = 1;
    }
    ctx->isfail = iVar9;
  }
LAB_0010a3e0:
  pMVar14 = build_parsedata(ctx);
  destroy_context(ctx);
  return pMVar14;
}

Assistant:

const MOJOSHADER_parseData *MOJOSHADER_parse(const char *profile,
                                             const char *mainfn,
                                             const unsigned char *tokenbuf,
                                             const unsigned int bufsize,
                                             const MOJOSHADER_swizzle *swiz,
                                             const unsigned int swizcount,
                                             const MOJOSHADER_samplerMap *smap,
                                             const unsigned int smapcount,
                                             MOJOSHADER_malloc m,
                                             MOJOSHADER_free f, void *d)
{
    MOJOSHADER_parseData *retval = NULL;
    Context *ctx = NULL;
    int rc = 0;
    int failed = 0;

    if ( ((m == NULL) && (f != NULL)) || ((m != NULL) && (f == NULL)) )
        return &MOJOSHADER_out_of_mem_data;  // supply both or neither.

    ctx = build_context(profile, mainfn, tokenbuf, bufsize, swiz, swizcount,
                        smap, smapcount, m, f, d);
    if (ctx == NULL)
        return &MOJOSHADER_out_of_mem_data;

    if (profile == NULL)  // build_context allows NULL; check this ourselves.
        fail(ctx, "Profile name is NULL");

    if (isfail(ctx))
    {
        retval = build_parsedata(ctx);
        destroy_context(ctx);
        return retval;
    } // if

    verify_swizzles(ctx);

    // Version token always comes first.
    ctx->current_position = 0;
    rc = parse_version_token(ctx, profile);

    if (!ctx->mainfn)
        ctx->mainfn = StrDup(ctx, "main");

    // drop out now if this definitely isn't bytecode. Saves lots of
    //  meaningless errors flooding through.
    if (rc < 0)
    {
        retval = build_parsedata(ctx);
        destroy_context(ctx);
        return retval;
    } // if

    if ( ((uint32) rc) > ctx->tokencount )
    {
        fail(ctx, "Corrupted or truncated shader");
        ctx->tokencount = rc;
    } // if

    adjust_token_position(ctx, rc);

    // parse out the rest of the tokens after the version token...
    while (ctx->tokencount > 0)
    {
        if (!ctx->know_shader_size)
            ctx->tokencount = 0xFFFFFFFF;  // keep this value obscenely large.

        // reset for each token.
        if (isfail(ctx))
        {
            failed = 1;
            ctx->isfail = 0;
        } // if

        rc = parse_token(ctx);
        if ( ((uint32) rc) > ctx->tokencount )
        {
            fail(ctx, "Corrupted or truncated shader");
            break;
        } // if

        adjust_token_position(ctx, rc);
    } // while

    ctx->current_position = MOJOSHADER_POSITION_AFTER;

    // for ps_1_*, the output color is written to r0...throw an
    //  error if this register was never written. This isn't
    //  important for vertex shaders, or shader model 2+.
    if (shader_is_pixel(ctx) && !shader_version_atleast(ctx, 2, 0))
    {
        if (!register_was_written(ctx, REG_TYPE_TEMP, 0))
            fail(ctx, "r0 (pixel shader 1.x color output) never written to");
    } // if

    if (!failed)
    {
        process_definitions(ctx);
        failed = isfail(ctx);
    } // if

    if (!failed)
        ctx->profile->finalize_emitter(ctx);

    ctx->isfail = failed;
    retval = build_parsedata(ctx);
    destroy_context(ctx);
    return retval;
}